

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudioVoice_EnableEffect(FAudioVoice *voice,uint32_t EffectIndex,uint32_t OperationSet)

{
  uint32_t in_EDX;
  uint32_t in_ESI;
  FAudioVoice *in_RDI;
  
  if ((in_EDX == 0) || (in_RDI->audio->active == '\0')) {
    FAudio_PlatformLockMutex((FAudioMutex)0x1279f3);
    (in_RDI->effects).desc[in_ESI].InitialState = 1;
    FAudio_PlatformUnlockMutex((FAudioMutex)0x127a1f);
  }
  else {
    FAudio_OPERATIONSET_QueueEnableEffect(in_RDI,in_ESI,in_EDX);
  }
  return 0;
}

Assistant:

uint32_t FAudioVoice_EnableEffect(
	FAudioVoice *voice,
	uint32_t EffectIndex,
	uint32_t OperationSet
) {
	LOG_API_ENTER(voice->audio)

	if (OperationSet != FAUDIO_COMMIT_NOW && voice->audio->active)
	{
		FAudio_OPERATIONSET_QueueEnableEffect(
			voice,
			EffectIndex,
			OperationSet
		);
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	FAudio_PlatformLockMutex(voice->effectLock);
	LOG_MUTEX_LOCK(voice->audio, voice->effectLock)
	voice->effects.desc[EffectIndex].InitialState = 1;
	FAudio_PlatformUnlockMutex(voice->effectLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->effectLock)
	LOG_API_EXIT(voice->audio)
	return 0;
}